

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void unicodeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  u32 iVal;
  uchar *z;
  uchar *local_10;
  
  local_10 = sqlite3_value_text(*argv);
  if ((local_10 != (uchar *)0x0) && (*local_10 != '\0')) {
    iVal = sqlite3Utf8Read(&local_10);
    sqlite3_result_int(context,iVal);
    return;
  }
  return;
}

Assistant:

static void unicodeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z = sqlite3_value_text(argv[0]);
  (void)argc;
  if( z && z[0] ) sqlite3_result_int(context, sqlite3Utf8Read(&z));
}